

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_solaris_tar_acl.c
# Opt level: O0

void test_compat_solaris_tar_acl(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_entry *local_38;
  archive_entry *ae;
  archive *a;
  char name [32];
  
  a = (archive *)0x6d6f635f74736574;
  builtin_strncpy(name,"pat_solaris_tar_acl.tar",0x18);
  ae = (archive_entry *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'Ù',(uint)(ae != (archive_entry *)0x0),"NULL != (a = archive_read_new())",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'Ú',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",ae);
  iVar1 = archive_read_support_format_all((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'Û',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",ae);
  extract_reference_file((char *)&a);
  wVar2 = archive_read_open_filename((archive_conflict *)ae,(char *)&a,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'Þ',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 10240)"
                      ,ae);
  iVar1 = archive_read_next_header((archive *)ae,&local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'á',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",ae);
  failure("One extended ACL should flag all ACLs to be returned.");
  wVar2 = archive_entry_acl_reset(local_38,L'Ā');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'ä',7,"7",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
             ,L'æ',local_38,(archive_test_acl_t *)acls0,L'\a',L'Ā',L'Ƥ');
  mVar3 = archive_entry_mode(local_38);
  failure("Basic ACLs should set mode to 0644, not %04o",(ulong)(mVar3 & 0x1ff));
  mVar3 = archive_entry_mode(local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'é',(uint)((mVar3 & 0x1ff) == 0x1a4),"(archive_entry_mode(ae) & 0777) == 0644"
                   ,(void *)0x0);
  iVar1 = archive_read_next_header((archive *)ae,&local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'ì',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",ae);
  wVar2 = archive_entry_acl_reset(local_38,L'Ā');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'î',6,"6",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
             ,L'ð',local_38,(archive_test_acl_t *)acls1,L'\x06',L'Ā',L'Ǩ');
  mVar3 = archive_entry_mode(local_38);
  failure("Basic ACLs should set mode to 0750, not %04o",(ulong)(mVar3 & 0x1ff));
  mVar3 = archive_entry_mode(local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'ó',(uint)((mVar3 & 0x1ff) == 0x1e8),"(archive_entry_mode(ae) & 0777) == 0750"
                   ,(void *)0x0);
  wVar2 = archive_entry_acl_reset(local_38,L'Ȁ');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'õ',6,"6",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_DEFAULT)",(void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
             ,L'÷',local_38,(archive_test_acl_t *)acls2,L'\x06',L'Ȁ',L'Ǩ');
  iVar1 = archive_read_next_header((archive *)ae,&local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'ú',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",ae);
  wVar2 = archive_entry_acl_reset(local_38,L'㰀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'ü',6,"6",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4)",(void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
             ,L'þ',local_38,(archive_test_acl_t *)acls3,L'\x06',L'㰀',L'\0');
  iVar1 = archive_read_next_header((archive *)ae,&local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                   ,L'ā',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",ae);
  wVar2 = archive_entry_acl_reset(local_38,L'㰀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'ă',5,"5",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4)",(void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
             ,L'ą',local_38,(archive_test_acl_t *)acls4,L'\x05',L'㰀',L'\0');
  iVar1 = archive_read_close((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'Ĉ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",ae);
  iVar1 = archive_read_free((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_solaris_tar_acl.c"
                      ,L'ĉ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_compat_solaris_tar_acl)
{
	char name[] = "test_compat_solaris_tar_acl.tar";
	struct archive *a;
	struct archive_entry *ae;

	/* Read archive file */
	assert(NULL != (a = archive_read_new()));
        assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
        assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
        extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name,
	    10240));

	/* First item has access ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	failure("One extended ACL should flag all ACLs to be returned.");
	assertEqualInt(7, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	assertEntryCompareAcls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS, 0644);
	failure("Basic ACLs should set mode to 0644, not %04o",
	    (unsigned int)archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0644);

	/* Second item has default and access ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualInt(6, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	assertEntryCompareAcls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS, 0750);
	failure("Basic ACLs should set mode to 0750, not %04o",
	    (unsigned int)archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0750);
	assertEqualInt(6, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_DEFAULT));
	assertEntryCompareAcls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_DEFAULT, 0750);

	/* Third item has NFS4 ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualInt(6, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4));
	assertEntryCompareAcls(ae, acls3, sizeof(acls3)/sizeof(acls3[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4, 0);

	/* Fourth item has NFS4 ACLs and inheritance flags */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualInt(5, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4));
	assertEntryCompareAcls(ae, acls4, sizeof(acls4)/sizeof(acls0[4]),
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4, 0);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}